

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

uint pugi::impl::anon_unknown_0::get_value_uint(char_t *value,uint def)

{
  int __base;
  ulong uVar1;
  int base;
  uint def_local;
  char_t *value_local;
  
  value_local._4_4_ = def;
  if (value != (char_t *)0x0) {
    __base = get_integer_base(value);
    uVar1 = strtoul(value,(char **)0x0,__base);
    value_local._4_4_ = (uint)uVar1;
  }
  return value_local._4_4_;
}

Assistant:

PUGI__FN unsigned int get_value_uint(const char_t* value, unsigned int def)
	{
		if (!value) return def;

		int base = get_integer_base(value);

	#ifdef PUGIXML_WCHAR_MODE
		return static_cast<unsigned int>(wcstoul(value, 0, base));
	#else
		return static_cast<unsigned int>(strtoul(value, 0, base));
	#endif
	}